

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSymmetry.cpp
# Opt level: O2

ComponentData * __thiscall
HighsSymmetryDetection::computeComponentData
          (ComponentData *__return_storage_ptr__,HighsSymmetryDetection *this,
          HighsSymmetries *symmetries)

{
  vector<int,std::allocator<int>> *pvVar1;
  HighsInt *__x;
  int *piVar2;
  pointer piVar3;
  pointer piVar4;
  pdqsort_detail *this_00;
  pdqsort_detail *ppVar5;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> end_00;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> this_01;
  HighsSymmetries *pHVar6;
  bool bVar7;
  int iVar8;
  HighsInt HVar9;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> begin;
  int iVar10;
  HighsInt i_1;
  long lVar11;
  HighsInt i_2;
  HighsInt i;
  long lVar12;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> _Var13;
  anon_class_16_2_164db4ee comp;
  undefined1 in_stack_ffffffffffffff68;
  HighsInt numUsedPerms;
  HighsInt currentComponent;
  HighsInt currentComponentStart;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_88;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_80;
  vector<int,_std::allocator<int>_> *local_78;
  vector<int,_std::allocator<int>_> *local_70;
  vector<int,_std::allocator<int>_> *local_68;
  HighsSymmetries *local_60;
  HighsHashTable<int,_void> currComponentOrbits;
  
  memset(__return_storage_ptr__,0,0x108);
  HighsDisjointSets<false>::reset(&__return_storage_ptr__->components,this->numActiveCols);
  local_78 = &__return_storage_ptr__->firstUnfixed;
  currComponentOrbits.entries._M_t.
  super___uniq_ptr_impl<HighsHashTableEntry<int,_void>,_HighsHashTable<int,_void>::OpNewDeleter>.
  _M_t.
  super__Tuple_impl<0UL,_HighsHashTableEntry<int,_void>_*,_HighsHashTable<int,_void>::OpNewDeleter>.
  super__Head_base<0UL,_HighsHashTableEntry<int,_void>_*,_false>._M_head_impl._0_4_ = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign
            (local_78,(long)symmetries->numPerms,(value_type_conflict2 *)&currComponentOrbits);
  currComponentOrbits.entries._M_t.
  super___uniq_ptr_impl<HighsHashTableEntry<int,_void>,_HighsHashTable<int,_void>::OpNewDeleter>.
  _M_t.
  super__Tuple_impl<0UL,_HighsHashTableEntry<int,_void>_*,_HighsHashTable<int,_void>::OpNewDeleter>.
  super__Head_base<0UL,_HighsHashTableEntry<int,_void>_*,_false>._M_head_impl._0_4_ = 0;
  local_88._M_current = (int *)__return_storage_ptr__;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign
            (&__return_storage_ptr__->numUnfixed,(long)symmetries->numPerms,
             (value_type_conflict2 *)&currComponentOrbits);
  __x = &this->numActiveCols;
  local_60 = symmetries;
  for (lVar12 = 0; pHVar6 = local_60, end_00._M_current = local_88._M_current,
      lVar12 < local_60->numPerms; lVar12 = lVar12 + 1) {
    iVar8 = *__x;
    iVar10 = iVar8 * (int)lVar12;
    piVar3 = (local_60->permutations).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start;
    for (lVar11 = 0; lVar11 < iVar8; lVar11 = lVar11 + 1) {
      iVar8 = piVar3[iVar10 + lVar11];
      if (iVar8 != (this->vertexGroundSet).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar11]) {
        HVar9 = (this->vertexPosition).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[iVar8];
        piVar2 = (__return_storage_ptr__->numUnfixed).super__Vector_base<int,_std::allocator<int>_>.
                 _M_impl.super__Vector_impl_data._M_start + lVar12;
        *piVar2 = *piVar2 + 1;
        piVar4 = (local_78->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        iVar8 = piVar4[lVar12];
        if (iVar8 == -1) {
          piVar4[lVar12] = HVar9;
        }
        else {
          HighsDisjointSets<false>::merge
                    ((HighsDisjointSets<false> *)local_88._M_current,iVar8,HVar9);
        }
      }
      iVar8 = *__x;
    }
  }
  pvVar1 = (vector<int,std::allocator<int>> *)(local_88._M_current + 0x18);
  piVar3 = (this->vertexGroundSet).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  std::vector<int,std::allocator<int>>::
  _M_assign_aux<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            (pvVar1,piVar3,piVar3 + this->numActiveCols);
  this_00 = *(pdqsort_detail **)(end_00._M_current + 0x18);
  ppVar5 = *(pdqsort_detail **)(end_00._M_current + 0x1a);
  if (this_00 != ppVar5) {
    local_80._M_current = (int *)ppVar5;
    iVar8 = pdqsort_detail::log2<long>((long)ppVar5 - (long)this_00 >> 2);
    comp.this._0_4_ = iVar8;
    comp.componentData = (ComponentData *)this;
    comp.this._4_4_ = 0;
    pdqsort_detail::
    pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsSymmetryDetection::computeComponentData(HighsSymmetries_const&)::__0,false>
              (this_00,local_80,end_00,comp,1,(bool)in_stack_ffffffffffffff68);
  }
  currentComponentStart = -1;
  currentComponent = -1;
  HighsHashTable<int,_void>::HighsHashTable(&currComponentOrbits);
  local_80._M_current = end_00._M_current + 0x12;
  local_68 = (vector<int,_std::allocator<int>_> *)(end_00._M_current + 0x24);
  local_70 = (vector<int,_std::allocator<int>_> *)(end_00._M_current + 0x1e);
  lVar12 = 0;
  while ((lVar12 < *__x &&
         (HVar9 = HighsDisjointSets<false>::getSet
                            ((HighsDisjointSets<false> *)end_00._M_current,
                             (this->vertexPosition).super__Vector_base<int,_std::allocator<int>_>.
                             _M_impl.super__Vector_impl_data._M_start
                             [*(int *)(*(long *)(end_00._M_current + 0x18) + lVar12 * 4)]),
         *(int *)(*(long *)end_00._M_current + (long)HVar9 * 4) != 1))) {
    if (HVar9 != currentComponent) {
      currentComponentStart = (HighsInt)lVar12;
      currentComponent = HVar9;
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)local_80._M_current,&currentComponentStart);
      std::vector<int,_std::allocator<int>_>::push_back(local_68,&currentComponent);
      std::vector<int,_std::allocator<int>_>::emplace_back<>(local_70);
      HighsHashTable<int,_void>::clear(&currComponentOrbits);
    }
    numUsedPerms = getOrbit(this,*(HighsInt *)(*(long *)pvVar1 + lVar12 * 4));
    bVar7 = HighsHashTable<int,_void>::insert<int>(&currComponentOrbits,&numUsedPerms);
    if (bVar7) {
      *(int *)(*(long *)(end_00._M_current + 0x20) + -4) =
           *(int *)(*(long *)(end_00._M_current + 0x20) + -4) + 1;
    }
    lVar12 = lVar12 + 1;
  }
  std::vector<int,_std::allocator<int>_>::reserve
            ((vector<int,_std::allocator<int>_> *)(end_00._M_current + 0x30),(long)pHVar6->numPerms)
  ;
  for (numUsedPerms = 0; this_01._M_current = local_80._M_current, numUsedPerms < pHVar6->numPerms;
      numUsedPerms = numUsedPerms + 1) {
    if ((local_78->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_start[numUsedPerms] != -1) {
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)(end_00._M_current + 0x30),&numUsedPerms);
    }
  }
  begin._M_current = end_00._M_current[0x30];
  end._M_current = end_00._M_current[0x32];
  _Var13._M_current = begin._M_current;
  if (begin._M_current != end._M_current) {
    iVar8 = pdqsort_detail::log2<long>((long)end._M_current - (long)begin._M_current >> 2);
    pdqsort_detail::
    pdqsort_loop<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,HighsSymmetryDetection::computeComponentData(HighsSymmetries_const&)::__1,false>
              (begin,end,(anon_class_8_1_56ae1867)end_00._M_current,iVar8,true);
    begin._M_current = end_00._M_current[0x32];
    _Var13._M_current = *(int **)(end_00._M_current + 0x30);
  }
  currentComponentStart = -1;
  currentComponent = -1;
  numUsedPerms = (HighsInt)((ulong)((long)begin._M_current - (long)_Var13._M_current) >> 2);
  lVar12 = (long)numUsedPerms;
  for (lVar11 = 0; lVar11 < lVar12; lVar11 = lVar11 + 1) {
    HVar9 = HighsDisjointSets<false>::getSet
                      ((HighsDisjointSets<false> *)local_88._M_current,
                       (((vector<int,_std::allocator<int>_> *)((long)local_88._M_current + 0xd8))->
                       super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start
                       [(((vector<int,_std::allocator<int>_> *)((long)local_88._M_current + 0xc0))->
                        super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start[lVar11]]);
    if (HVar9 != currentComponent) {
      currentComponentStart = (HighsInt)lVar11;
      currentComponent = HVar9;
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)(end_00._M_current + 0x2a),
                 &currentComponentStart);
    }
  }
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)(end_00._M_current + 0x2a),&numUsedPerms);
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)this_01._M_current,__x);
  HighsHashTable<int,_void>::~HighsHashTable(&currComponentOrbits);
  return (ComponentData *)local_88._M_current;
}

Assistant:

HighsSymmetryDetection::ComponentData
HighsSymmetryDetection::computeComponentData(
    const HighsSymmetries& symmetries) {
  ComponentData componentData;

  componentData.components.reset(numActiveCols);
  componentData.firstUnfixed.assign(symmetries.numPerms, -1);
  componentData.numUnfixed.assign(symmetries.numPerms, 0);
  for (HighsInt i = 0; i < symmetries.numPerms; ++i) {
    const HighsInt* perm = symmetries.permutations.data() + i * numActiveCols;

    for (HighsInt j = 0; j < numActiveCols; ++j) {
      if (perm[j] != vertexGroundSet[j]) {
        HighsInt pos = vertexPosition[perm[j]];
        componentData.numUnfixed[i] += 1;
        if (componentData.firstUnfixed[i] != -1)
          componentData.components.merge(componentData.firstUnfixed[i], pos);
        else
          componentData.firstUnfixed[i] = pos;
      }
    }
  }

  componentData.componentSets.assign(vertexGroundSet.begin(),
                                     vertexGroundSet.begin() + numActiveCols);
  pdqsort(componentData.componentSets.begin(),
          componentData.componentSets.end(), [&](HighsInt u, HighsInt v) {
            HighsInt uComp = componentData.components.getSet(vertexPosition[u]);
            HighsInt vComp = componentData.components.getSet(vertexPosition[v]);
            return std::make_pair(
                       componentData.components.getSetSize(uComp) == 1, uComp) <
                   std::make_pair(
                       componentData.components.getSetSize(vComp) == 1, vComp);
          });

  HighsInt currentComponentStart = -1;
  HighsInt currentComponent = -1;
  HighsHashTable<HighsInt> currComponentOrbits;
  for (HighsInt i = 0; i < numActiveCols; ++i) {
    HighsInt comp = componentData.components.getSet(
        vertexPosition[componentData.componentSets[i]]);
    if (componentData.components.getSetSize(comp) == 1) break;
    if (comp != currentComponent) {
      currentComponent = comp;
      currentComponentStart = i;
      componentData.componentStarts.push_back(currentComponentStart);
      componentData.componentNumber.push_back(currentComponent);
      componentData.componentNumOrbits.emplace_back();
      currComponentOrbits.clear();
    }

    if (currComponentOrbits.insert(getOrbit(componentData.componentSets[i]))) {
      ++componentData.componentNumOrbits.back();
    }
  }

  componentData.permComponents.reserve(symmetries.numPerms);

  for (HighsInt i = 0; i < symmetries.numPerms; ++i) {
    if (componentData.firstUnfixed[i] == -1) continue;
    componentData.permComponents.push_back(i);
  }

  pdqsort(componentData.permComponents.begin(),
          componentData.permComponents.end(), [&](HighsInt i, HighsInt j) {
            HighsInt seti =
                componentData.components.getSet(componentData.firstUnfixed[i]);
            HighsInt setj =
                componentData.components.getSet(componentData.firstUnfixed[j]);
            return std::make_pair(seti, componentData.numUnfixed[i]) <
                   std::make_pair(setj, componentData.numUnfixed[j]);
          });

  currentComponentStart = -1;
  currentComponent = -1;

  HighsInt numUsedPerms = componentData.permComponents.size();

  for (HighsInt i = 0; i < numUsedPerms; ++i) {
    HighsInt p = componentData.permComponents[i];
    HighsInt comp =
        componentData.components.getSet(componentData.firstUnfixed[p]);
    if (comp != currentComponent) {
      currentComponent = comp;
      currentComponentStart = i;
      componentData.permComponentStarts.push_back(currentComponentStart);
    }
  }

  assert(componentData.permComponentStarts.size() ==
         componentData.componentStarts.size());
  componentData.permComponentStarts.push_back(numUsedPerms);

  // HighsInt numComponents = componentData.componentStarts.size();
  // printf("found %d components\n", numComponents);
  componentData.componentStarts.push_back(numActiveCols);

  return componentData;
}